

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_event_accept.c
# Opt level: O1

ngx_int_t ngx_enable_accept_events(ngx_cycle_t *cycle)

{
  ngx_event_t *pnVar1;
  ngx_int_t nVar2;
  ulong uVar3;
  long *plVar4;
  
  if ((cycle->listening).nelts != 0) {
    plVar4 = (long *)((long)(cycle->listening).elts + 200);
    uVar3 = 0;
    do {
      if (((*plVar4 != 0) && (pnVar1 = *(ngx_event_t **)(*plVar4 + 8), (pnVar1->field_0x8 & 8) == 0)
          ) && (nVar2 = (*ngx_event_actions.add)(pnVar1,1,0), nVar2 == -1)) {
        return -1;
      }
      uVar3 = uVar3 + 1;
      plVar4 = plVar4 + 0x1c;
    } while (uVar3 < (cycle->listening).nelts);
  }
  return 0;
}

Assistant:

static ngx_int_t
ngx_enable_accept_events(ngx_cycle_t *cycle)
{
    ngx_uint_t         i;
    ngx_listening_t   *ls;
    ngx_connection_t  *c;

    ls = cycle->listening.elts;
    for (i = 0; i < cycle->listening.nelts; i++) {

        c = ls[i].connection;

        if (c == NULL || c->read->active) {
            continue;
        }

        if (ngx_add_event(c->read, NGX_READ_EVENT, 0) == NGX_ERROR) {
            return NGX_ERROR;
        }
    }

    return NGX_OK;
}